

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O3

void __thiscall test_adjacency_graph_degree_Test::TestBody(test_adjacency_graph_degree_Test *this)

{
  AssertHelper AVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  StringLike<const_char_*> *regex;
  AssertHelper AVar7;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  DeathTest *gtest_dt;
  Adjacency_Graph<true> graph;
  AssertHelper local_158;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_150;
  int local_144;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_140;
  undefined1 local_128 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  Adjacency_Graph<false> local_58 [48];
  
  local_128 = (undefined1  [8])0x3;
  local_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uStack_118._0_1_ = false;
  uStack_118._1_7_ = 0;
  local_110 = 1;
  local_108 = 7;
  local_100 = 4;
  local_f8 = 6;
  local_f0 = 7;
  local_e8 = 2;
  local_e0 = 5;
  local_d8 = 3;
  local_d0 = 4;
  local_c8 = 6;
  local_c0 = 3;
  local_b8 = 4;
  local_b0 = 5;
  local_a8 = 4;
  local_a0 = 6;
  local_98 = 7;
  local_90 = 4;
  local_88 = 5;
  local_80 = 7;
  local_78 = 2;
  local_70 = 1;
  local_68 = 1;
  local_60 = 4;
  edge_graph._M_len = 0xd;
  edge_graph._M_array = (iterator)local_128;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(local_58,edge_graph);
  local_158.data_ = (AssertHelperData *)0x0;
  local_150._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Graph<false>::degree(local_58,(size_t *)&local_158);
  local_144 = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_128,"graph.degree(0)","2",(unsigned_long *)&local_150,&local_144);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_120._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x22b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if (local_150._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_150._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_120._M_pi);
  }
  local_158.data_ = (AssertHelperData *)0x3;
  local_150._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Graph<false>::degree(local_58,(size_t *)&local_158);
  local_144 = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_128,"graph.degree(3)","3",(unsigned_long *)&local_150,&local_144);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_120._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x22c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if (local_150._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_150._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_120._M_pi);
  }
  local_158.data_ = (AssertHelperData *)&DAT_00000004;
  local_150._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Graph<false>::degree(local_58,(size_t *)&local_158);
  local_144 = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_128,"graph.degree(4)","5",(unsigned_long *)&local_150,&local_144);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_120._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x22d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if (local_150._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_150._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_120._M_pi);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_150._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x158308;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_128,
               (testing *)&local_150,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_140,(PolymorphicMatcher *)local_128);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("1 == graph.degree(50)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_140,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
                       ,0x22e,(DeathTest **)&local_158);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_140);
    AVar7.data_ = local_158.data_;
    if (!bVar2) goto LAB_0011e887;
    if (local_158.data_ == (AssertHelperData *)0x0) goto LAB_0011e8dd;
    iVar4 = (**(code **)(*(long *)local_158.data_ + 0x10))(local_158.data_);
    AVar1.data_ = local_158.data_;
    if (iVar4 == 0) {
      iVar4 = (**(code **)(*(long *)local_158.data_ + 0x18))(local_158.data_);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
      cVar3 = (**(code **)(*(long *)AVar1.data_ + 0x20))(AVar1.data_,bVar2);
      if (cVar3 == '\0') {
        (**(code **)(*(long *)AVar7.data_ + 8))(AVar7.data_);
        goto LAB_0011e887;
      }
    }
    else if (iVar4 == 1) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        local_128 = (undefined1  [8])0x32;
        Disa::Adjacency_Graph<false>::degree(local_58,(size_t *)local_128);
      }
      (**(code **)(*(long *)local_158.data_ + 0x28))(local_158.data_,2);
      (**(code **)(*(long *)AVar1.data_ + 0x28))(AVar1.data_,0);
    }
    lVar6 = *(long *)AVar7.data_;
  }
  else {
LAB_0011e887:
    testing::Message::Message((Message *)local_128);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x22e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
    if (local_128 == (undefined1  [8])0x0) goto LAB_0011e8dd;
    lVar6 = *(long *)local_128;
    AVar7.data_ = (AssertHelperData *)local_128;
  }
  (**(code **)(lVar6 + 8))(AVar7.data_);
LAB_0011e8dd:
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(local_58);
  return;
}

Assistant:

TEST(test_adjacency_graph, degree) {

  Adjacency_Graph<false> graph = create_graph_hybrid();

  EXPECT_EQ(graph.degree(0), 2);
  EXPECT_EQ(graph.degree(3), 3);
  EXPECT_EQ(graph.degree(4), 5);
  EXPECT_DEATH(1 == graph.degree(50), "./*");
}